

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageFileExt::~CVmImageFileExt(CVmImageFileExt *this)

{
  CVmImageFileExt_blk *pCVar1;
  CVmImageFileExt_blk *pCVar2;
  
  (this->super_CVmImageFile)._vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_0032b3f8;
  pCVar2 = this->mem_head_;
  while (pCVar2 != (CVmImageFileExt_blk *)0x0) {
    pCVar1 = pCVar2->nxt_;
    free(pCVar2->block_ptr_);
    operator_delete(pCVar2,0x28);
    pCVar2 = pCVar1;
  }
  return;
}

Assistant:

CVmImageFileExt::~CVmImageFileExt()
{
    CVmImageFileExt_blk *cur;
    CVmImageFileExt_blk *nxt;
    
    /* run through the list of allocated blocks and delete each one */
    for (cur = mem_head_ ; cur != 0 ; cur = nxt)
    {
        /* remember the next block, since we're deleting this one */
        nxt = cur->nxt_;

        /* delete this one */
        delete cur;
    }
}